

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType(UniformType *this,UniformType *param_1)

{
  pair<int,_int> pVar1;
  
  this->enumType = param_1->enumType;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->arraySizesSegmented,&param_1->arraySizesSegmented);
  this->arraySize = param_1->arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes,&param_1->childTypes);
  std::__cxx11::string::string((string *)&this->strType,(string *)&param_1->strType);
  std::__cxx11::string::string((string *)&this->refStrType,(string *)&param_1->refStrType);
  pVar1 = param_1->size;
  *(undefined8 *)((long)&(this->size).second + 2) =
       *(undefined8 *)((long)&(param_1->size).second + 2);
  this->size = pVar1;
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}